

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_getexp_m68k(floatx80 a,float_status *status)

{
  floatx80 fVar1;
  floatx80 fVar2;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  uint64_t local_40;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  uint16_t local_10;
  
  status_local = (float_status *)a.low;
  a_local.low._0_2_ = a.high;
  fVar1._10_6_ = 0;
  fVar1.low = (long)a._0_10_;
  fVar1.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  local_40 = extractFloatx80Frac(fVar1);
  a_00.high = (uint16_t)a_local.low;
  a_00.low = (uint64_t)status_local;
  a_00._10_6_ = 0;
  aSig._0_4_ = extractFloatx80Exp(a_00);
  a_01.high = (uint16_t)a_local.low;
  a_01.low = (uint64_t)status_local;
  a_01._10_6_ = 0;
  aSig._7_1_ = extractFloatx80Sign(a_01);
  if ((int32_t)aSig == 0x7fff) {
    if ((local_40 & 0x7fffffffffffffff) == 0) {
      float_raise_m68k('\x01',_aExp);
      fVar1 = floatx80_default_nan_m68k(_aExp);
      local_10 = fVar1.high;
    }
    else {
      a_02.high = (uint16_t)a_local.low;
      a_02.low = (uint64_t)status_local;
      a_02._10_6_ = 0;
      fVar1 = propagateFloatx80NaNOneArg(a_02,_aExp);
      local_10 = fVar1.high;
    }
  }
  else {
    if ((int32_t)aSig == 0) {
      if (local_40 == 0) {
        fVar1 = packFloatx80(aSig._7_1_,0,0);
        local_10 = fVar1.high;
        goto LAB_008b068b;
      }
      normalizeFloatx80Subnormal_m68k(local_40,(int32_t *)&aSig,&local_40);
    }
    fVar1 = int32_to_floatx80_m68k((int32_t)aSig + -0x3fff,_aExp);
    local_10 = fVar1.high;
  }
LAB_008b068b:
  a_local._8_8_ = fVar1.low;
  fVar2._10_6_ = fVar1._10_6_;
  fVar2.high = local_10;
  fVar2.low = a_local._8_8_;
  return fVar2;
}

Assistant:

floatx80 floatx80_getexp(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a , status);
        }
        float_raise(float_flag_invalid , status);
        return floatx80_default_nan(status);
    }

    if (aExp == 0) {
        if (aSig == 0) {
            return packFloatx80(aSign, 0, 0);
        }
        normalizeFloatx80Subnormal(aSig, &aExp, &aSig);
    }

    return int32_to_floatx80(aExp - 0x3FFF, status);
}